

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O2

void api_suite::api_signed_output(void)

{
  int result;
  char input [3];
  undefined4 local_164;
  decoder_type decoder;
  
  input[2] = '\0';
  input[0] = '4';
  input[1] = '2';
  trial::protocol::json::detail::basic_decoder<char>::basic_decoder<3ul>(&decoder,&input);
  result = decoder.current.code;
  local_164 = 8;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::integer",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x4d,"void api_suite::api_signed_output()",&result,&local_164);
  result = 0;
  trial::protocol::json::detail::basic_decoder<char>::signed_value<int>(&decoder,&result);
  local_164 = 0x2a;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("result","42",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x50,"void api_suite::api_signed_output()",&result,&local_164);
  return;
}

Assistant:

void api_signed_output()
{
    const char input[] = "42";
    decoder_type decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::integer);
    int result = {};
    TRIAL_PROTOCOL_TEST_NO_THROW(decoder.signed_value(result));
    TRIAL_PROTOCOL_TEST_EQUAL(result, 42);
}